

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseAdditionSubtraction(StructuralParser *this)

{
  double *pdVar1;
  bool bVar2;
  Op op;
  Expression *a;
  TokenType token;
  Expression *pEVar3;
  Context context;
  Context local_48;
  
  a = parseMultiplyDivide(this);
  do {
    while( true ) {
      bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x25865e,(TokenType)0x27ad79);
      if (!bVar2) break;
      local_48.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
      if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_48.location.location.data = (this->super_SOULTokeniser).location.location.data;
      local_48.parentScope = this->currentScope;
      token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::skip(&this->super_SOULTokeniser);
      op = getBinaryOpForToken(token);
      pEVar3 = parseMultiplyDivide(this);
      a = createBinaryOperator(this,&local_48,a,pEVar3,op);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
    }
    bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,(TokenType)0x259eeb,(TokenType)0x259ef6);
    if ((!bVar2) || (-1 < (this->super_SOULTokeniser).literalIntValue)) {
      bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x259f90,(TokenType)0x259f99,(TokenType)0x259f80,
                         (TokenType)0x259f88);
      if ((!bVar2) ||
         (pdVar1 = &(this->super_SOULTokeniser).literalDoubleValue, 0.0 < *pdVar1 || *pdVar1 == 0.0)
         ) {
        return a;
      }
    }
    local_48.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_48.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_48.parentScope = this->currentScope;
    pEVar3 = parseMultiplyDivide(this);
    a = createBinaryOperator(this,&local_48,a,pEVar3,add);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
  } while( true );
}

Assistant:

AST::Expression& parseAdditionSubtraction()
    {
        for (pool_ref<AST::Expression> a = parseMultiplyDivide();;)
        {
            if (! matchesAny (Operator::plus, Operator::minus))
            {
                // Handle the annoying case where some sloppy coder has written a
                // minus sign without a space after it, e.g. (x -1)
                if ((matchesAny (Token::literalInt32, Token::literalInt64) && literalIntValue < 0)
                     || (matchesAny (Token::literalFloat64, Token::literalFloat32, Token::literalImag32, Token::literalImag64) && literalDoubleValue < 0))
                {
                    auto context = getContext();
                    a = createBinaryOperator (context, a, parseMultiplyDivide(), BinaryOp::Op::add);
                    continue;
                }

                return a;
            }

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseMultiplyDivide(), type);
        }
    }